

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O1

void __thiscall
gss::TimedRestartsSchedule::TimedRestartsSchedule
          (TimedRestartsSchedule *this,milliseconds d,unsigned_long_long m)

{
  long lVar1;
  
  (this->super_RestartsSchedule)._vptr_RestartsSchedule =
       (_func_int **)&PTR__RestartsSchedule_001ed288;
  this->_number_of_backtracks = 0;
  this->_minimum_backtracks = m;
  (this->_duration).__r = d.__r;
  lVar1 = std::chrono::_V2::steady_clock::now();
  (this->_next_restart_point).__d.__r = d.__r * 1000000 + lVar1;
  return;
}

Assistant:

TimedRestartsSchedule::TimedRestartsSchedule(milliseconds d, unsigned long long m) :
    _number_of_backtracks(0),
    _minimum_backtracks(m),
    _duration(d),
    _next_restart_point(steady_clock::now() + d)
{
}